

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void C_ArchiveAliases(FConfigFile *f)

{
  uint uVar1;
  FConsoleAlias *local_20;
  FConsoleCommand *alias;
  int bucket;
  FConfigFile *f_local;
  
  for (alias._4_4_ = 0; alias._4_4_ < 0xfb; alias._4_4_ = alias._4_4_ + 1) {
    for (local_20 = (FConsoleAlias *)Commands[alias._4_4_]; local_20 != (FConsoleAlias *)0x0;
        local_20 = (FConsoleAlias *)(local_20->super_FConsoleCommand).m_Next) {
      uVar1 = (*(local_20->super_FConsoleCommand)._vptr_FConsoleCommand[2])();
      if ((uVar1 & 1) != 0) {
        FConsoleAlias::Archive(local_20,f);
      }
    }
  }
  return;
}

Assistant:

void C_ArchiveAliases (FConfigFile *f)
{
	int bucket;
	FConsoleCommand *alias;

	for (bucket = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		alias = Commands[bucket];
		while (alias)
		{
			if (alias->IsAlias())
				static_cast<FConsoleAlias *>(alias)->Archive (f);
			alias = alias->m_Next;
		}
	}
}